

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O2

bool __thiscall soul::Module::Functions::contains(Functions *this,Function *f)

{
  pool_ref<soul::heart::Function> *ppVar1;
  
  ppVar1 = (this->functions).items;
  ppVar1 = std::
           __find_if<soul::pool_ref<soul::heart::Function>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Function_const>>
                     (ppVar1,ppVar1 + (this->functions).numActive,f);
  return ppVar1 != (this->functions).items + (this->functions).numActive;
}

Assistant:

bool Module::Functions::contains (const heart::Function& f) const           { return soul::contains (functions, f); }